

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::copyLowPrefixFromNulTerminated
          (Normalizer2Impl *this,UChar *src,UChar32 minNeedDataCP,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar c;
  UChar *prevSrc;
  UErrorCode *errorCode_local;
  ReorderingBuffer *buffer_local;
  UChar *pUStack_18;
  UChar32 minNeedDataCP_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  pUVar1 = src;
  do {
    pUStack_18 = pUVar1;
    pUVar1 = pUStack_18 + 1;
  } while ((int)(uint)(ushort)*pUStack_18 < minNeedDataCP && *pUStack_18 != L'\0');
  if ((pUStack_18 != src) && (buffer != (ReorderingBuffer *)0x0)) {
    ReorderingBuffer::appendZeroCC(buffer,src,pUStack_18,errorCode);
  }
  return pUStack_18;
}

Assistant:

const UChar *
Normalizer2Impl::copyLowPrefixFromNulTerminated(const UChar *src,
                                                UChar32 minNeedDataCP,
                                                ReorderingBuffer *buffer,
                                                UErrorCode &errorCode) const {
    // Make some effort to support NUL-terminated strings reasonably.
    // Take the part of the fast quick check loop that does not look up
    // data and check the first part of the string.
    // After this prefix, determine the string length to simplify the rest
    // of the code.
    const UChar *prevSrc=src;
    UChar c;
    while((c=*src++)<minNeedDataCP && c!=0) {}
    // Back out the last character for full processing.
    // Copy this prefix.
    if(--src!=prevSrc) {
        if(buffer!=NULL) {
            buffer->appendZeroCC(prevSrc, src, errorCode);
        }
    }
    return src;
}